

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
duckdb::Serializer::WriteValue<std::pair<double,unsigned_long>>
          (Serializer *this,vector<std::pair<double,_unsigned_long>,_true> *vec)

{
  pointer ppVar1;
  pair<double,_unsigned_long> *item;
  pointer pair;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->
                        super_vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                        ).
                        super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(vec->
                        super_vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                        ).
                        super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
  ppVar1 = (vec->
           super_vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
           ).
           super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pair = (vec->
              super_vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
              ).
              super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start; pair != ppVar1; pair = pair + 1) {
    WriteValue<double,unsigned_long>(this,pair);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}